

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-stm.c
# Opt level: O0

int ldeletereader(lua_State *L)

{
  undefined8 *puVar1;
  boxreader *box;
  lua_State *L_local;
  
  puVar1 = (undefined8 *)lua_touserdata(L,1);
  stm_releasereader((stm_object *)*puVar1);
  *puVar1 = 0;
  stm_releasecopy((stm_copy *)puVar1[1]);
  puVar1[1] = 0;
  return 0;
}

Assistant:

static int
ldeletereader(lua_State *L) {
	struct boxreader * box = lua_touserdata(L, 1);
	stm_releasereader(box->obj);
	box->obj = NULL;
	stm_releasecopy(box->lastcopy);
	box->lastcopy = NULL;

	return 0;
}